

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O0

MPP_RET hal_info_from_enc_cfg(HalInfo ctx,MppEncCfgSet *cfg)

{
  int iVar1;
  RK_U64 RVar2;
  RK_U64 val;
  HalInfo pvStack_38;
  RK_U32 profile;
  HalInfoImpl *info;
  MppEncCodecCfg *codec;
  MppEncPrepCfg *prep;
  MppEncRcCfg *rc;
  MppEncCfgSet *cfg_local;
  HalInfo ctx_local;
  
  prep = (MppEncPrepCfg *)&cfg->rc;
  codec = (MppEncCodecCfg *)&cfg->prep;
  info = (HalInfoImpl *)&cfg->codec;
  val._4_4_ = 0;
  pvStack_38 = ctx;
  rc = (MppEncRcCfg *)cfg;
  cfg_local = (MppEncCfgSet *)ctx;
  hal_info_set(ctx,1,1,(long)(cfg->prep).width);
  hal_info_set(cfg_local,2,1,(long)(int)(codec->field_1).change);
  RVar2 = hal_info_to_string(cfg_local,3,(void *)((long)pvStack_38 + 4));
  hal_info_set(cfg_local,3,2,RVar2);
  hal_info_set(cfg_local,4,1,(long)((int)prep->format / (int)prep->color));
  hal_info_set(cfg_local,5,1,(long)((int)prep->colortrc / (int)prep->range));
  RVar2 = hal_info_to_string(cfg_local,6,&prep->width);
  hal_info_set(cfg_local,6,2,RVar2);
  hal_info_set(cfg_local,7,1,(long)prep->hor_stride);
  hal_info_set(cfg_local,8,1,(long)(int)prep->chroma_ds_mode);
  iVar1 = *(int *)((long)pvStack_38 + 4);
  if (iVar1 == 7) {
    val._4_4_ = *(RK_U32 *)((long)&info[1].elems + 4);
  }
  else if ((1 < iVar1 - 8U) && (iVar1 == 0x1000004)) {
    val._4_4_ = info->elem_nb;
  }
  RVar2 = hal_info_to_string(cfg_local,10,(void *)((long)&val + 4));
  hal_info_set(cfg_local,10,2,RVar2);
  return MPP_OK;
}

Assistant:

MPP_RET hal_info_from_enc_cfg(HalInfo ctx, MppEncCfgSet *cfg)
{
    MppEncRcCfg *rc = &cfg->rc;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncCodecCfg *codec = &cfg->codec;
    HalInfoImpl *info = (HalInfoImpl *)ctx;
    RK_U32 profile = 0;
    RK_U64 val = 0;

    hal_info_set(ctx, ENC_INFO_WIDTH, CODEC_INFO_FLAG_NUMBER, prep->width);
    hal_info_set(ctx, ENC_INFO_HEIGHT, CODEC_INFO_FLAG_NUMBER, prep->height);

    val = hal_info_to_string(ctx, ENC_INFO_FORMAT, &info->coding);

    hal_info_set(ctx, ENC_INFO_FORMAT, CODEC_INFO_FLAG_STRING, val);
    hal_info_set(ctx, ENC_INFO_FPS_IN, CODEC_INFO_FLAG_NUMBER,
                 rc->fps_in_num / rc->fps_in_denom);
    hal_info_set(ctx, ENC_INFO_FPS_OUT, CODEC_INFO_FLAG_NUMBER,
                 rc->fps_out_num / rc->fps_out_denom);

    val = hal_info_to_string(ctx, ENC_INFO_RC_MODE, &rc->rc_mode);
    hal_info_set(ctx, ENC_INFO_RC_MODE, CODEC_INFO_FLAG_STRING, val);

    hal_info_set(ctx, ENC_INFO_BITRATE, CODEC_INFO_FLAG_NUMBER, rc->bps_target);
    hal_info_set(ctx, ENC_INFO_GOP_SIZE, CODEC_INFO_FLAG_NUMBER, rc->gop);

    switch (info->coding) {
    case MPP_VIDEO_CodingAVC : {
        profile = codec->h264.profile;
    } break;
    case MPP_VIDEO_CodingHEVC : {
        profile = codec->h265.profile;
    } break;
    case MPP_VIDEO_CodingMJPEG :
    case MPP_VIDEO_CodingVP8 :
    default : {
    } break;
    }
    val = hal_info_to_string(ctx, ENC_INFO_PROFILE, &profile);
    hal_info_set(ctx, ENC_INFO_PROFILE, CODEC_INFO_FLAG_STRING, val);

    return MPP_OK;
}